

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteList.c
# Opt level: O0

void Io_WriteListEdge(FILE *pFile,Abc_Obj_t *pObj)

{
  int iVar1;
  char *pcVar2;
  Abc_Obj_t *pObj_00;
  int local_24;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pObj_local;
  FILE *pFile_local;
  
  pcVar2 = Abc_ObjName(pObj);
  fprintf((FILE *)pFile,"%-10s >    ",pcVar2);
  for (local_24 = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_24 < iVar1; local_24 = local_24 + 1) {
    pObj_00 = Abc_ObjFanout(pObj,local_24);
    pcVar2 = Abc_ObjName(pObj_00);
    fprintf((FILE *)pFile," %s",pcVar2);
    pcVar2 = Abc_ObjName(pObj);
    fprintf((FILE *)pFile," ([%s_to_",pcVar2);
    pcVar2 = Abc_ObjName(pObj_00);
    fprintf((FILE *)pFile,"%s] = %d)",pcVar2,0);
    iVar1 = Abc_ObjFanoutNum(pObj);
    if (local_24 != iVar1 + -1) {
      fprintf((FILE *)pFile,",");
    }
  }
  fprintf((FILE *)pFile,".");
  fprintf((FILE *)pFile,"\n");
  return;
}

Assistant:

void Io_WriteListEdge( FILE * pFile, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i;
    fprintf( pFile, "%-10s >    ", Abc_ObjName(pObj) );
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        fprintf( pFile, " %s", Abc_ObjName(pFanout) );
        fprintf( pFile, " ([%s_to_", Abc_ObjName(pObj) );
//        fprintf( pFile, "%s] = %d)", Abc_ObjName(pFanout), Seq_ObjFanoutL(pObj, pFanout) );
        fprintf( pFile, "%s] = %d)", Abc_ObjName(pFanout), 0 );
        if ( i != Abc_ObjFanoutNum(pObj) - 1 )
            fprintf( pFile, "," );
    }
    fprintf( pFile, "." );
    fprintf( pFile, "\n" );
}